

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O0

LargeRep * __thiscall
google::protobuf::internal::MicroString::AllocateOwnedRep
          (MicroString *this,size_t size,Arena *arena)

{
  LargeRepKind t;
  int v1;
  int v2;
  LargeRepKind *v2_00;
  char *pcVar1;
  LogMessage *pLVar2;
  LogMessage local_b8;
  Voidify local_a1;
  Nullable<const_char_*> local_a0;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  void *alloc_1;
  size_t alloc_size;
  SizedPtr alloc;
  LogMessage local_68;
  Voidify local_55;
  LargeRepKind local_54;
  unsigned_long local_50;
  Nullable<const_char_*> local_48;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  LargeRep *h;
  size_t capacity;
  Arena *arena_local;
  size_t size_local;
  MicroString *this_local;
  size_t local_10;
  
  h = (LargeRep *)size;
  capacity = (size_t)arena;
  arena_local = (Arena *)size;
  size_local = (size_t)this;
  local_50 = absl::lts_20250127::log_internal::GetReferenceableValue(size);
  local_54 = kOwned;
  v2_00 = absl::lts_20250127::log_internal::
          GetReferenceableValue<google::protobuf::internal::MicroString::LargeRepKind>(&local_54);
  local_48 = absl::lts_20250127::log_internal::
             Check_GEImpl<unsigned_long,google::protobuf::internal::MicroString::LargeRepKind>
                       (&local_50,v2_00,"capacity >= kOwned");
  if (local_48 != (Nullable<const_char_*>)0x0) {
    pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_48);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string.cc"
               ,0x7d,pcVar1);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_55,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_68);
  }
  if (capacity == 0) {
    local_10 = OwnedRepSize((size_t)h);
    _alloc_size = AllocateAtLeast(local_10 + 7 & 0xfffffffffffffff8);
    h = (LargeRep *)((long)alloc.p + -0x10);
    absl_log_internal_check_op_result = (Nullable<const_char_*>)alloc_size;
  }
  else {
    this_local = (MicroString *)OwnedRepSize((size_t)h);
    alloc_1 = (void *)((ulong)((long)&this_local->rep_ + 7U) & 0xfffffffffffffff8);
    h = (LargeRep *)((long)alloc_1 - 0x10);
    absl_log_internal_check_op_result_1 =
         (Nullable<const_char_*>)Arena::AllocateAligned((Arena *)capacity,(size_t)alloc_1,8);
    absl_log_internal_check_op_result = absl_log_internal_check_op_result_1;
  }
  this->rep_ = (void *)((ulong)absl_log_internal_check_op_result | 1);
  *(int *)(absl_log_internal_check_op_result + 0xc) = (int)h;
  pcVar1 = LargeRep::owned_head((LargeRep *)absl_log_internal_check_op_result);
  *(char **)absl_log_internal_check_op_result = pcVar1;
  LargeRep::SetInitialSize((LargeRep *)absl_log_internal_check_op_result,(size_t)arena_local);
  t = large_rep_kind(this);
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue(t);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue(3);
  local_a0 = absl::lts_20250127::log_internal::Check_EQImpl(v1,v2,"+large_rep_kind() == +kOwned");
  if (local_a0 != (Nullable<const_char_*>)0x0) {
    pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_a0);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string.cc"
               ,0x90,pcVar1);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b8);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_a1,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_b8);
  }
  return (LargeRep *)absl_log_internal_check_op_result;
}

Assistant:

MicroString::LargeRep* MicroString::AllocateOwnedRep(size_t size,
                                                     Arena* arena) {
  size_t capacity = size;
  LargeRep* h;
  ABSL_DCHECK_GE(capacity, kOwned);
  if (arena == nullptr) {
    const internal::SizedPtr alloc = internal::AllocateAtLeast(
        ArenaAlignDefault::Ceil(OwnedRepSize(capacity)));
    capacity = alloc.n - sizeof(LargeRep);
    h = reinterpret_cast<LargeRep*>(alloc.p);
  } else {
    size_t alloc_size = ArenaAlignDefault::Ceil(OwnedRepSize(capacity));
    capacity = alloc_size - sizeof(LargeRep);
    auto* alloc = arena->AllocateAligned(alloc_size);
    h = reinterpret_cast<LargeRep*>(alloc);
  }

  rep_ =
      reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(h) | kIsLargeRepTag);
  h->capacity = capacity;
  h->payload = h->owned_head();
  h->SetInitialSize(size);

  ABSL_DCHECK_EQ(+large_rep_kind(), +kOwned);

  return h;
}